

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

bool llvm::APInt::tcIsZero(WordType *src,uint parts)

{
  WordType *pWVar1;
  uint uVar2;
  long lVar3;
  
  if ((parts == 0) || (*src != 0)) {
    return parts == 0;
  }
  lVar3 = 1;
  do {
    uVar2 = (uint)lVar3;
    if (parts == uVar2) break;
    pWVar1 = src + lVar3;
    lVar3 = lVar3 + 1;
  } while (*pWVar1 == 0);
  return parts <= uVar2;
}

Assistant:

bool APInt::tcIsZero(const WordType *src, unsigned parts) {
  for (unsigned i = 0; i < parts; i++)
    if (src[i])
      return false;

  return true;
}